

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_NtkParseInt(char *pStr,Ifn_Ntk_t *p)

{
  int *pnObjs;
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *format;
  int iNode;
  char *pFinal;
  uint local_2c;
  char *local_28;
  
  pnObjs = &p->nObjs;
  iVar2 = Ifn_ManStrCheck(pStr,&p->nInps,pnObjs);
  if (iVar2 != 0) {
    uVar1 = p->nInps;
    if ((int)uVar1 < 0xc) {
      if ((((int)uVar1 < 2) || (*pnObjs <= (int)uVar1)) || (0x15 < *pnObjs)) {
        __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x124,"int Ifn_NtkParseInt(char *, Ifn_Ntk_t *)");
      }
      uVar3 = (byte)*pStr - 0x3c;
      if (((uVar3 < 0x40) && ((0x8000000080000001U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) ||
         (*pStr == 0x28)) {
        local_2c = uVar1;
        iVar2 = Ifn_NtkParseInt_rec(pStr,p,&local_28,(int *)&local_2c);
        if (iVar2 == 0) {
          return 0;
        }
        if ((*local_28 == '\0') || (*local_28 == ';')) {
          if (local_2c == *pnObjs) {
            return 1;
          }
          format = "Mismatch in the number of nodes.\n";
        }
        else {
          format = "The last symbol should be \';\'.\n";
        }
      }
      else {
        format = "The first symbol should be one of the symbols: (, [, <, {.\n";
      }
      Ifn_ErrorMessage(format);
    }
    else {
      Ifn_ErrorMessage("The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
                       ,(ulong)uVar1,0xb);
    }
  }
  return 0;
}

Assistant:

int Ifn_NtkParseInt( char * pStr, Ifn_Ntk_t * p )
{
    char * pFinal; int iNode;
    if ( !Ifn_ManStrCheck(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    if ( !Inf_ManOpenSymb(pStr) )
        return Ifn_ErrorMessage( "The first symbol should be one of the symbols: (, [, <, {.\n" );
    iNode = p->nInps;
    if ( !Ifn_NtkParseInt_rec( pStr, p, &pFinal, &iNode ) )
        return 0;
    if ( pFinal[0] && pFinal[0] != ';' )
        return Ifn_ErrorMessage( "The last symbol should be \';\'.\n" );
    if ( iNode != p->nObjs )
        return Ifn_ErrorMessage( "Mismatch in the number of nodes.\n" );
    return 1;
}